

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bandit.h
# Opt level: O0

bool __thiscall
bandit::run_policy::bandit::should_run(bandit *this,string *it_name,stack_t *contexts)

{
  bool bVar1;
  uint uVar2;
  reference pfVar3;
  byte local_a4;
  bool local_a3;
  bool local_a1;
  bool only_applies;
  bool skip_applies;
  undefined1 local_68 [7];
  bool match;
  filter_chain_element filter;
  const_iterator __end2;
  const_iterator __begin2;
  filter_chain_t *__range2;
  stack_t *contexts_local;
  string *it_name_local;
  bandit *this_local;
  
  if ((this->dry_run_ & 1U) == 0) {
    if (((this->break_on_failure_ & 1U) == 0) ||
       (uVar2 = (*(this->super_interface)._vptr_interface[4])(), (uVar2 & 1) == 0)) {
      bVar1 = has_context_with_hard_skip(this,contexts);
      if (bVar1) {
        this_local._7_1_ = 0;
      }
      else {
        __end2 = std::
                 vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
                 ::begin(&this->filter_chain_);
        filter._32_8_ =
             std::
             vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>
             ::end(&this->filter_chain_);
        while (bVar1 = __gnu_cxx::operator!=
                                 (&__end2,(__normal_iterator<const_bandit::run_policy::filter_chain_element_*,_std::vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>_>
                                           *)&filter.skip), bVar1) {
          pfVar3 = __gnu_cxx::
                   __normal_iterator<const_bandit::run_policy::filter_chain_element_*,_std::vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>_>
                   ::operator*(&__end2);
          filter_chain_element::filter_chain_element((filter_chain_element *)local_68,pfVar3);
          bVar1 = context_matches_pattern(this,contexts,(string *)local_68);
          local_a1 = true;
          if (!bVar1) {
            local_a1 = matches_pattern(this,it_name,(string *)local_68);
          }
          local_a3 = false;
          if ((filter.pattern.field_2._M_local_buf[8] & 1U) != 0) {
            local_a3 = local_a1;
          }
          local_a4 = 0;
          if ((filter.pattern.field_2._M_local_buf[8] & 1U) == 0) {
            local_a4 = local_a1 ^ 0xff;
          }
          if ((local_a3 == false) && ((local_a4 & 1) == 0)) {
            bVar1 = false;
          }
          else {
            this_local._7_1_ = 0;
            bVar1 = true;
          }
          filter_chain_element::~filter_chain_element((filter_chain_element *)local_68);
          if (bVar1) goto LAB_00122862;
          __gnu_cxx::
          __normal_iterator<const_bandit::run_policy::filter_chain_element_*,_std::vector<bandit::run_policy::filter_chain_element,_std::allocator<bandit::run_policy::filter_chain_element>_>_>
          ::operator++(&__end2);
        }
        this_local._7_1_ = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
    }
  }
  else {
    this_local._7_1_ = 0;
  }
LAB_00122862:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool should_run(const std::string& it_name, const context::stack_t& contexts) const override {
        if (dry_run_) {
          return false;
        }

        if (break_on_failure_ && has_encountered_failure()) {
          return false;
        }

        // Never run if a context has been marked as skip
        // using 'describe_skip'
        if (has_context_with_hard_skip(contexts)) {
          return false;
        }

        // Now go through the filter chain
        for (auto filter : filter_chain_) {
          bool match = context_matches_pattern(contexts, filter.pattern) || matches_pattern(it_name, filter.pattern);
          bool skip_applies = filter.skip && match;
          bool only_applies = !filter.skip && !match;
          if (skip_applies || only_applies) {
            return false;
          }
        }

        return true;
      }